

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int newupvalue(FuncState *fs,TString *name,expdesc *v)

{
  byte bVar1;
  Proto *o;
  Upvaldesc *pUVar2;
  int local_2c;
  int oldsize;
  Proto *f;
  expdesc *v_local;
  TString *name_local;
  FuncState *fs_local;
  
  o = fs->f;
  local_2c = o->sizeupvalues;
  checklimit(fs,fs->nups + 1,0xff,"upvalues");
  if (o->sizeupvalues < (int)(fs->nups + 1)) {
    pUVar2 = (Upvaldesc *)luaM_growaux_(fs->ls->L,o->upvalues,&o->sizeupvalues,0x10,0xff,"upvalues")
    ;
    o->upvalues = pUVar2;
  }
  while (local_2c < o->sizeupvalues) {
    o->upvalues[local_2c].name = (TString *)0x0;
    local_2c = local_2c + 1;
  }
  o->upvalues[fs->nups].instack = v->k == VLOCAL;
  o->upvalues[fs->nups].idx = (lu_byte)(v->u).info;
  o->upvalues[fs->nups].name = name;
  if (((o->marked & 4) != 0) && ((name->marked & 3) != 0)) {
    luaC_barrier_(fs->ls->L,(GCObject *)o,(GCObject *)name);
  }
  bVar1 = fs->nups;
  fs->nups = bVar1 + 1;
  return (int)bVar1;
}

Assistant:

static int newupvalue(FuncState *fs, TString *name, expdesc *v) {
    Proto *f = fs->f;
    int oldsize = f->sizeupvalues;
    checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
    luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                    Upvaldesc, MAXUPVAL, "upvalues");
    while (oldsize < f->sizeupvalues)
        f->upvalues[oldsize++].name = NULL;
    f->upvalues[fs->nups].instack = (v->k == VLOCAL);
    f->upvalues[fs->nups].idx = cast_byte(v->u.info);
    f->upvalues[fs->nups].name = name;
    luaC_objbarrier(fs->ls->L, f, name);
    return fs->nups++;
}